

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case1972(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1e2;
  allocator<char> local_1e1;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1e0;
  string local_1c8;
  SyntaxKind local_1a8 [24];
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,
             "\n                     __builtin_choose_expr ( 0 ,\n                             __builtin_choose_expr ( 1 ,\n                                    sizeof ( int ) ,\n                                    sizeof ( double ) ) ,\n                             __builtin_choose_expr ( 2 , x , y ) )\n                    "
             ,&local_1e1);
  Expectation::Expectation(&local_178);
  local_1a8[8] = AbstractDeclarator;
  local_1a8[9] = SizeofExpression;
  local_1a8[10] = TypeNameAsTypeReference;
  local_1a8[0xb] = TypeName;
  local_1a8[0xc] = BasicTypeSpecifier;
  local_1a8[0xd] = AbstractDeclarator;
  local_1a8[0xe] = ExtGNU_ChooseExpression;
  local_1a8[0xf] = IntegerConstantExpression;
  local_1a8[0] = ExtGNU_ChooseExpression;
  local_1a8[1] = IntegerConstantExpression;
  local_1a8[2] = ExtGNU_ChooseExpression;
  local_1a8[3] = IntegerConstantExpression;
  local_1a8[4] = SizeofExpression;
  local_1a8[5] = TypeNameAsTypeReference;
  local_1a8[6] = TypeName;
  local_1a8[7] = BasicTypeSpecifier;
  local_1a8[0x10] = IdentifierName;
  local_1a8[0x11] = IdentifierName;
  __l._M_len = 0x12;
  __l._M_array = local_1a8;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1e0,__l,
             &local_1e2);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1e0);
  Expectation::Expectation(&local_c0,pEVar1);
  parseExpression(this,&local_1c8,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1e0);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

void ParserTester::case1972()
{
    parseExpression(R"(
                     __builtin_choose_expr ( 0 ,
                             __builtin_choose_expr ( 1 ,
                                    sizeof ( int ) ,
                                    sizeof ( double ) ) ,
                             __builtin_choose_expr ( 2 , x , y ) )
                    )",
                    Expectation().AST( { SyntaxKind::ExtGNU_ChooseExpression,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::ExtGNU_ChooseExpression,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::SizeofExpression,
                                         SyntaxKind::TypeNameAsTypeReference,
                                         SyntaxKind::TypeName,
                                         SyntaxKind::BasicTypeSpecifier,
                                         SyntaxKind::AbstractDeclarator,
                                         SyntaxKind::SizeofExpression,
                                         SyntaxKind::TypeNameAsTypeReference,
                                         SyntaxKind::TypeName,
                                         SyntaxKind::BasicTypeSpecifier,
                                         SyntaxKind::AbstractDeclarator,
                                         SyntaxKind::ExtGNU_ChooseExpression,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::IdentifierName,
                                         SyntaxKind::IdentifierName }));
}